

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O2

PrimInfo *
embree::sse2::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,Geometry *geometry,uint geomID,size_t numPrimRefs,
          mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  int iVar7;
  task *ptVar8;
  runtime_error *prVar9;
  size_t *psVar10;
  unsigned_long end;
  _func_int **pp_Var11;
  ulong uVar12;
  unsigned_long end_1;
  _func_int **pp_Var13;
  PrimInfoT<embree::BBox<embree::Vec3fa>_> *this;
  bool bVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  size_t sVar19;
  size_t sVar20;
  auto_partitioner local_29e1;
  size_t taskCount;
  ulong **local_29d8;
  task_traits local_29d0;
  uint geomID_local;
  Geometry *geometry_local;
  ulong local_29b8 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_29a8;
  undefined1 local_2998 [16];
  BuildProgressMonitor *local_2980;
  mvector<PrimRef> *local_2978;
  size_t local_2970;
  Geometry **local_2968;
  mvector<PrimRef> *local_2960;
  uint *local_2958;
  ulong *local_2950;
  ulong *local_2948;
  size_t *local_2940;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *local_2938;
  Geometry ***local_2930;
  undefined8 local_2928;
  undefined8 uStack_2920;
  undefined8 local_2918;
  undefined8 uStack_2910;
  undefined8 local_2908;
  undefined8 uStack_2900;
  undefined8 local_28f8;
  undefined8 uStack_28f0;
  size_t local_28e8;
  size_t sStack_28e0;
  undefined8 local_28d8;
  undefined4 local_28d0;
  wait_context local_28c8;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  
  geomID_local = geomID;
  geometry_local = geometry;
  local_2980 = progressMonitor;
  local_2970 = numPrimRefs;
  (**progressMonitor->_vptr_BuildProgressMonitor)(progressMonitor,0);
  uVar1 = geometry->numPrimitives;
  local_29b8[1] = 0;
  local_29b8[0] = (ulong)uVar1;
  local_2978 = prims;
  local_2968 = &geometry_local;
  local_2960 = prims;
  local_2958 = &geomID_local;
  iVar7 = tbb::detail::d1::max_concurrency();
  pp_Var13 = (_func_int **)((ulong)uVar1 + 0x3ff >> 10);
  if ((_func_int **)(long)iVar7 < pp_Var13) {
    pp_Var13 = (_func_int **)(long)iVar7;
  }
  pp_Var11 = (_func_int **)0x40;
  if (pp_Var13 < (_func_int **)0x40) {
    pp_Var11 = pp_Var13;
  }
  local_2940 = &taskCount;
  taskCount = (size_t)pp_Var11;
  local_2950 = local_29b8 + 1;
  local_2948 = local_29b8;
  local_2938 = &pstate;
  local_2930 = &local_2968;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_29d8 = &local_2950;
  if (pp_Var13 != (_func_int **)0x0) {
    local_29d0.m_version_and_traits = 0;
    ptVar8 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_29d0,0xc0);
    ptVar8->m_reserved[3] = 0;
    ptVar8->m_reserved[4] = 0;
    ptVar8->m_reserved[5] = 0;
    ptVar8->m_reserved[1] = 0;
    ptVar8->m_reserved[2] = 0;
    (ptVar8->super_task_traits).m_version_and_traits = 0;
    ptVar8->m_reserved[0] = 0;
    ptVar8->_vptr_task = (_func_int **)&PTR__task_021d95e0;
    ptVar8[1]._vptr_task = pp_Var11;
    ptVar8[1].super_task_traits.m_version_and_traits = 0;
    ptVar8[1].m_reserved[0] = 1;
    ptVar8[1].m_reserved[1] = (uint64_t)&local_29d8;
    ptVar8[1].m_reserved[2] = 0;
    ptVar8[1].m_reserved[3] = 1;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar8[1].m_reserved + 5),&local_29e1);
    ptVar8[2].super_task_traits.m_version_and_traits = local_29d0.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar8[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar8,&context,&local_28c8,&context);
  }
  cVar6 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar6 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = 0x7f8000007f800000;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = 0x7f8000007f800000;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = 0xff800000ff800000;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = 0xff800000ff800000;
    local_2998._8_8_ = 0x7f8000007f800000;
    local_2998._0_8_ = 0x7f8000007f800000;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = 0x7f8000007f800000;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = 0x7f8000007f800000;
    local_29a8._8_8_ = 0xff800000ff800000;
    local_29a8._0_8_ = 0xff800000ff800000;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = 0xff800000ff800000;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = 0xff800000ff800000;
    this = pstate.sums;
    __return_storage_ptr__->begin = 0;
    __return_storage_ptr__->end = 0;
    sVar19 = 0;
    sVar20 = 0;
    for (uVar12 = 0; uVar12 < taskCount; uVar12 = uVar12 + 1) {
      local_2928 = *(undefined8 *)
                    &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                     field_0;
      uStack_2920 = *(undefined8 *)
                     ((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.
                             lower.field_0 + 8);
      local_2918 = *(undefined8 *)
                    &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.
                     field_0;
      uStack_2910 = *(undefined8 *)
                     ((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.
                             upper.field_0 + 8);
      local_2908 = *(undefined8 *)
                    &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.
                     field_0;
      uStack_2900 = *(undefined8 *)
                     ((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.
                             lower.field_0 + 8);
      local_28f8 = *(undefined8 *)
                    &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.
                     field_0;
      uStack_28f0 = *(undefined8 *)
                     ((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.
                             upper.field_0 + 8);
      local_28e8 = this[-0x40].begin;
      sStack_28e0 = this[-0x40].end;
      PrimInfoT<embree::BBox<embree::Vec3fa>_>::operator=(this,__return_storage_ptr__);
      auVar2._8_8_ = uStack_2920;
      auVar2._0_8_ = local_2928;
      aVar15.m128 = (__m128)minps((__return_storage_ptr__->
                                  super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
                                  field_0,auVar2);
      auVar3._8_8_ = uStack_2910;
      auVar3._0_8_ = local_2918;
      aVar16.m128 = (__m128)maxps((__return_storage_ptr__->
                                  super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
                                  field_0,auVar3);
      auVar4._8_8_ = uStack_2900;
      auVar4._0_8_ = local_2908;
      aVar17.m128 = (__m128)minps((__return_storage_ptr__->
                                  super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
                                  field_0,auVar4);
      auVar5._8_8_ = uStack_28f0;
      auVar5._0_8_ = local_28f8;
      aVar18.m128 = (__m128)maxps((__return_storage_ptr__->
                                  super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
                                  field_0,auVar5);
      sVar19 = local_28e8 + __return_storage_ptr__->begin;
      sVar20 = sStack_28e0 + __return_storage_ptr__->end;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = aVar15;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = aVar16;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = aVar17;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = aVar18;
      __return_storage_ptr__->begin = sVar19;
      __return_storage_ptr__->end = sVar20;
      this = this + 1;
    }
    if (sVar20 - sVar19 != local_2970) {
      (**local_2980->_vptr_BuildProgressMonitor)(local_2980,0);
      uVar1 = geometry_local->numPrimitives;
      local_2968 = &geometry_local;
      local_2960 = local_2978;
      local_2958 = &geomID_local;
      local_29b8[1] = 0;
      local_29b8[0] = (ulong)uVar1;
      iVar7 = tbb::detail::d1::max_concurrency();
      pp_Var13 = (_func_int **)((ulong)uVar1 + 0x3ff >> 10);
      if ((_func_int **)(long)iVar7 < pp_Var13) {
        pp_Var13 = (_func_int **)(long)iVar7;
      }
      pp_Var11 = (_func_int **)0x40;
      if (pp_Var13 < (_func_int **)0x40) {
        pp_Var11 = pp_Var13;
      }
      local_2950 = local_29b8 + 1;
      local_2948 = local_29b8;
      local_2940 = &taskCount;
      local_2930 = &local_2968;
      taskCount = (size_t)pp_Var11;
      local_2938 = &pstate;
      tbb::detail::d1::task_group_context::task_group_context
                (&context,(context_traits)0x4,CUSTOM_CTX);
      local_29d8 = &local_2950;
      if (pp_Var13 != (_func_int **)0x0) {
        local_29d0.m_version_and_traits = 0;
        ptVar8 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_29d0,0xc0);
        ptVar8->m_reserved[3] = 0;
        ptVar8->m_reserved[4] = 0;
        ptVar8->m_reserved[5] = 0;
        ptVar8->m_reserved[1] = 0;
        ptVar8->m_reserved[2] = 0;
        (ptVar8->super_task_traits).m_version_and_traits = 0;
        ptVar8->m_reserved[0] = 0;
        ptVar8->_vptr_task = (_func_int **)&PTR__task_021d9628;
        ptVar8[1]._vptr_task = pp_Var11;
        ptVar8[1].super_task_traits.m_version_and_traits = 0;
        ptVar8[1].m_reserved[0] = 1;
        ptVar8[1].m_reserved[1] = (uint64_t)&local_29d8;
        ptVar8[1].m_reserved[2] = 0;
        ptVar8[1].m_reserved[3] = 1;
        tbb::detail::d1::auto_partition_type::auto_partition_type
                  ((auto_partition_type *)(ptVar8[1].m_reserved + 5),&local_29e1);
        ptVar8[2].super_task_traits.m_version_and_traits = local_29d0.m_version_and_traits;
        local_28d8 = 0;
        local_28d0 = 1;
        local_28c8.m_version_and_traits = 1;
        local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)1;
        ptVar8[1].m_reserved[4] = (uint64_t)&local_28d8;
        tbb::detail::r1::execute_and_wait(ptVar8,&context,&local_28c8,&context);
      }
      cVar6 = tbb::detail::r1::is_group_execution_cancelled(&context);
      if (cVar6 != '\0') {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"task cancelled");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context(&context);
      psVar10 = &pstate.sums[0].end;
      sVar19 = 0;
      sVar20 = 0;
      aVar15 = _DAT_01f45a30;
      aVar16 = _DAT_01f45a40;
      while (bVar14 = taskCount != 0, taskCount = taskCount - 1, bVar14) {
        *(undefined1 (*) [16])
         (((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar10 + -9))->
         super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.m128 = local_2998;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -7) = local_29a8;
        (((BBox3fa *)(psVar10 + -5))->lower).field_0 = aVar15;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -3) = aVar16;
        psVar10[-1] = sVar19;
        *psVar10 = sVar20;
        local_2998 = minps(local_2998,*(undefined1 (*) [16])(psVar10 + -0x289));
        local_29a8.m128 = (__m128)maxps(local_29a8.m128,*(undefined1 (*) [16])(psVar10 + -0x287));
        aVar15.m128 = (__m128)minps(aVar15.m128,*(undefined1 (*) [16])(psVar10 + -0x285));
        aVar16.m128 = (__m128)maxps(aVar16.m128,*(undefined1 (*) [16])(psVar10 + -0x283));
        sVar19 = sVar19 + psVar10[-0x281];
        sVar20 = sVar20 + psVar10[-0x280];
        psVar10 = psVar10 + 10;
      }
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
        field_0 = local_2998._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               lower.field_0 + 8) = local_2998._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
        field_0 = local_29a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               upper.field_0 + 8) = local_29a8._8_8_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = aVar15;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = aVar16;
      __return_storage_ptr__->begin = sVar19;
      __return_storage_ptr__->end = sVar20;
    }
    return __return_storage_ptr__;
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"task cancelled");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PrimInfo createPrimRefArray(Geometry* geometry, unsigned int geomID, const size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelPrefixSumState<PrimInfo> pstate;
      
      /* first try */
      progressMonitor(0);
      PrimInfo pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
          return geometry->createPrimRefArray(prims,r,r.begin(),geomID);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
          return geometry->createPrimRefArray(prims,r,base.size(),geomID);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      }
      return pinfo;
    }